

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

int run_container_intersection_cardinality(run_container_t *src_1,run_container_t *src_2)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  rle16_t *prVar4;
  rle16_t *prVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  bool bVar19;
  bool bVar20;
  
  prVar4 = src_1->runs;
  uVar1 = prVar4->value;
  iVar7 = src_1->n_runs;
  if (uVar1 == 0 && iVar7 == 1) {
    bVar19 = prVar4->length == 0xffff;
  }
  else {
    bVar19 = false;
  }
  prVar5 = src_2->runs;
  uVar2 = prVar5->value;
  iVar3 = src_2->n_runs;
  if (uVar2 == 0 && iVar3 == 1) {
    bVar20 = prVar5->length == 0xffff;
  }
  else {
    bVar20 = false;
  }
  if (!bVar19 && !bVar20) {
LAB_0011908e:
    iVar8 = 0;
    if (0 < iVar3 && 0 < iVar7) {
      uVar13 = (uint)uVar1;
      uVar14 = (uint)uVar2;
      uVar11 = (uint)uVar2 + (uint)prVar5->length + 1;
      uVar6 = (uint)uVar1 + (uint)prVar4->length + 1;
      iVar15 = 0;
      iVar17 = 0;
      iVar8 = 0;
      do {
        if (uVar14 < uVar6) {
          if (uVar13 < uVar11) {
            uVar18 = uVar14;
            if (uVar14 < uVar13) {
              uVar18 = uVar13;
            }
            uVar10 = uVar6;
            if (uVar6 == uVar11) {
              iVar16 = iVar17 + 1;
              if (iVar16 < iVar7) {
                uVar13 = (uint)prVar4[iVar16].value;
                uVar6 = prVar4[iVar16].length + uVar13 + 1;
              }
              iVar15 = iVar15 + 1;
              if (iVar15 < iVar3) {
                uVar14 = (uint)prVar5[iVar15].value;
                iVar17 = iVar16;
                uVar11 = prVar5[iVar15].length + uVar14 + 1;
              }
              else {
LAB_001191ac:
                iVar17 = iVar17 + 1;
              }
            }
            else {
              if (uVar6 < uVar11) {
                iVar16 = iVar17 + 1;
                if (iVar16 < iVar7) {
                  uVar13 = (uint)prVar4[iVar16].value;
                  uVar6 = prVar4[iVar16].length + uVar13 + 1;
                }
                goto LAB_001191ac;
              }
              iVar15 = iVar15 + 1;
              uVar10 = uVar11;
              if (iVar15 < iVar3) {
                uVar14 = (uint)prVar5[iVar15].value;
                uVar11 = uVar14 + prVar5[iVar15].length + 1;
              }
            }
            iVar8 = (iVar8 - uVar18) + uVar10;
          }
          else {
            iVar15 = iVar15 + 1;
            if (iVar15 < iVar3) {
              uVar14 = (uint)prVar5[iVar15].value;
              uVar11 = uVar14 + prVar5[iVar15].length + 1;
            }
          }
        }
        else {
          iVar17 = iVar17 + 1;
          if (iVar17 < iVar7) {
            uVar13 = (uint)prVar4[iVar17].value;
            uVar6 = prVar4[iVar17].length + uVar13 + 1;
          }
        }
      } while ((iVar17 < iVar7) && (iVar15 < iVar3));
    }
    return iVar8;
  }
  if (bVar19) {
    uVar6 = croaring_hardware_support();
    src_1 = src_2;
    if ((uVar6 & 2) != 0) {
LAB_001191e8:
      iVar7 = _avx512_run_container_cardinality(src_1);
      return iVar7;
    }
    uVar6 = croaring_hardware_support();
    if ((uVar6 & 1) == 0) {
      iVar7 = src_2->n_runs;
      lVar9 = (long)iVar7;
      if (lVar9 < 1) {
        return iVar7;
      }
      lVar12 = 0;
      do {
        iVar7 = iVar7 + (uint)src_2->runs[lVar12].length;
        lVar12 = lVar12 + 1;
      } while (lVar9 != lVar12);
      return iVar7;
    }
  }
  else {
    if (!bVar20) goto LAB_0011908e;
    uVar6 = croaring_hardware_support();
    if ((uVar6 & 2) != 0) goto LAB_001191e8;
    uVar6 = croaring_hardware_support();
    if ((uVar6 & 1) == 0) {
      iVar7 = src_1->n_runs;
      lVar9 = (long)iVar7;
      if (lVar9 < 1) {
        return iVar7;
      }
      lVar12 = 0;
      do {
        iVar7 = iVar7 + (uint)src_1->runs[lVar12].length;
        lVar12 = lVar12 + 1;
      } while (lVar9 != lVar12);
      return iVar7;
    }
  }
  iVar7 = _avx2_run_container_cardinality(src_1);
  return iVar7;
}

Assistant:

int run_container_intersection_cardinality(const run_container_t *src_1,
                                           const run_container_t *src_2) {
    const bool if1 = run_container_is_full(src_1);
    const bool if2 = run_container_is_full(src_2);
    if (if1 || if2) {
        if (if1) {
            return run_container_cardinality(src_2);
        }
        if (if2) {
            return run_container_cardinality(src_1);
        }
    }
    int answer = 0;
    int32_t rlepos = 0;
    int32_t xrlepos = 0;
    int32_t start = src_1->runs[rlepos].value;
    int32_t end = start + src_1->runs[rlepos].length + 1;
    int32_t xstart = src_2->runs[xrlepos].value;
    int32_t xend = xstart + src_2->runs[xrlepos].length + 1;
    while ((rlepos < src_1->n_runs) && (xrlepos < src_2->n_runs)) {
        if (end <= xstart) {
            ++rlepos;
            if (rlepos < src_1->n_runs) {
                start = src_1->runs[rlepos].value;
                end = start + src_1->runs[rlepos].length + 1;
            }
        } else if (xend <= start) {
            ++xrlepos;
            if (xrlepos < src_2->n_runs) {
                xstart = src_2->runs[xrlepos].value;
                xend = xstart + src_2->runs[xrlepos].length + 1;
            }
        } else {  // they overlap
            const int32_t lateststart = start > xstart ? start : xstart;
            int32_t earliestend;
            if (end == xend) {  // improbable
                earliestend = end;
                rlepos++;
                xrlepos++;
                if (rlepos < src_1->n_runs) {
                    start = src_1->runs[rlepos].value;
                    end = start + src_1->runs[rlepos].length + 1;
                }
                if (xrlepos < src_2->n_runs) {
                    xstart = src_2->runs[xrlepos].value;
                    xend = xstart + src_2->runs[xrlepos].length + 1;
                }
            } else if (end < xend) {
                earliestend = end;
                rlepos++;
                if (rlepos < src_1->n_runs) {
                    start = src_1->runs[rlepos].value;
                    end = start + src_1->runs[rlepos].length + 1;
                }

            } else {  // end > xend
                earliestend = xend;
                xrlepos++;
                if (xrlepos < src_2->n_runs) {
                    xstart = src_2->runs[xrlepos].value;
                    xend = xstart + src_2->runs[xrlepos].length + 1;
                }
            }
            answer += earliestend - lateststart;
        }
    }
    return answer;
}